

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void free_parser(vw *all)

{
  io_buf *piVar1;
  example *peVar2;
  size_type sVar3;
  parser *ppVar4;
  
  v_array<substring>::delete_v(&all->p->words);
  v_array<substring>::delete_v(&all->p->name);
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    v_array<unsigned_long>::delete_v(&all->p->gram_mask);
  }
  piVar1 = all->p->output;
  if (piVar1 != (io_buf *)0x0) {
    v_array<char>::delete_v(&piVar1->finalname);
    v_array<char>::delete_v(&piVar1->currentname);
  }
  while (ppVar4 = all->p,
        (ppVar4->example_pool).m_pool.c.super__Deque_base<example_*,_std::allocator<example_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (ppVar4->example_pool).m_pool.c.super__Deque_base<example_*,_std::allocator<example_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
    peVar2 = VW::object_pool<example,_example_initializer>::get_object(&ppVar4->example_pool);
    VW::dealloc_example((all->p->lp).delete_label,peVar2,all->delete_prediction);
  }
  while( true ) {
    sVar3 = std::deque<example_*,_std::allocator<example_*>_>::size
                      (&(ppVar4->ready_parsed_examples).object_queue.c);
    if (sVar3 == 0) break;
    peVar2 = VW::ptr_queue<example>::pop(&all->p->ready_parsed_examples);
    VW::dealloc_example((all->p->lp).delete_label,peVar2,all->delete_prediction);
    ppVar4 = all->p;
  }
  v_array<unsigned_long>::delete_v(&all->p->counts);
  return;
}

Assistant:

void free_parser(vw& all)
{
  all.p->words.delete_v();
  all.p->name.delete_v();

  if (all.ngram_strings.size() > 0)
    all.p->gram_mask.delete_v();

  io_buf* output = all.p->output;
  if (output != nullptr)
  {
    output->finalname.delete_v();
    output->currentname.delete_v();
  }

  while (! all.p->example_pool.empty())
    {
      example* temp = all.p->example_pool.get_object();
      VW::dealloc_example(all.p->lp.delete_label, *temp, all.delete_prediction);
    }

  while (all.p->ready_parsed_examples.size() != 0)
    {
      example* temp = all.p->ready_parsed_examples.pop();
      VW::dealloc_example(all.p->lp.delete_label, *temp, all.delete_prediction);
    }
  all.p->counts.delete_v();
}